

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_std::error_code> *
__thiscall
pstore::json::details::string_matcher<pstore::json::null_output>::consume_normal_state
          (tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_std::error_code>
           *__return_storage_ptr__,string_matcher<pstore::json::null_output> *this,
          parser<pstore::json::null_output> *parser,char32_t code_point,appender *app)

{
  bool bVar1;
  null_output *pnVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  error_code eVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  int local_70;
  undefined4 uStack_6c;
  error_category *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  int local_58;
  undefined4 uStack_54;
  error_category *local_50;
  undefined1 local_48 [8];
  error_code error;
  state next_state;
  appender *app_local;
  char32_t code_point_local;
  parser<pstore::json::null_output> *parser_local;
  string_matcher<pstore::json::null_output> *this_local;
  
  error._M_cat._4_4_ = 3;
  std::error_code::error_code((error_code *)local_48);
  if (code_point == L'\"') {
    bVar1 = appender::has_high_surrogate(app);
    if (bVar1) {
      std::error_code::operator=((error_code *)local_48,bad_unicode_code_point);
    }
    else if (((this->super_matcher<pstore::json::null_output>).field_0xc & 1) == 0) {
      pnVar2 = parser<pstore::json::null_output>::callbacks(parser);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 appender::result_abi_cxx11_(app);
      pbVar3 = pstore::gsl::not_null::operator_cast_to_string_((not_null *)&local_78);
      eVar4 = null_output::string_value(pnVar2,pbVar3);
      local_68 = eVar4._M_cat;
      local_70 = eVar4._M_value;
      local_48._4_4_ = uStack_6c;
      local_48._0_4_ = local_70;
      error._0_8_ = local_68;
    }
    else {
      pnVar2 = parser<pstore::json::null_output>::callbacks(parser);
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 appender::result_abi_cxx11_(app);
      pbVar3 = pstore::gsl::not_null::operator_cast_to_string_((not_null *)&local_60);
      eVar4 = null_output::key(pnVar2,pbVar3);
      local_50 = eVar4._M_cat;
      local_58 = eVar4._M_value;
      local_48._4_4_ = uStack_54;
      local_48._0_4_ = local_58;
      error._0_8_ = local_50;
    }
    error._M_cat._4_4_ = 1;
  }
  else if (code_point == L'\\') {
    error._M_cat._4_4_ = 4;
  }
  else if ((uint)code_point < 0x20) {
    std::error_code::operator=((error_code *)local_48,bad_unicode_code_point);
  }
  else {
    bVar1 = appender::append32(app,code_point);
    if (!bVar1) {
      std::error_code::operator=((error_code *)local_48,bad_unicode_code_point);
    }
  }
  std::
  make_tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state&,std::error_code&>
            (__return_storage_ptr__,(state *)((long)&error._M_cat + 4),(error_code *)local_48);
  return __return_storage_ptr__;
}

Assistant:

auto string_matcher<Callbacks>::consume_normal_state (parser<Callbacks> & parser,
                                                                  char32_t code_point,
                                                                  appender & app)
                -> std::tuple<state, std::error_code> {
                state next_state = normal_char_state;
                std::error_code error;

                if (code_point == '"') {
                    if (app.has_high_surrogate ()) {
                        error = error_code::bad_unicode_code_point;
                    } else {
                        // Consume the closing quote character.
                        if (object_key_) {
                            error = parser.callbacks ().key (*app.result ());
                        } else {
                            error = parser.callbacks ().string_value (*app.result ());
                        }
                    }
                    next_state = done_state;
                } else if (code_point == '\\') {
                    next_state = escape_state;
                } else if (code_point <= 0x1F) {
                    // Control characters U+0000 through U+001F MUST be escaped.
                    error = error_code::bad_unicode_code_point;
                } else {
                    if (!app.append32 (code_point)) {
                        error = error_code::bad_unicode_code_point;
                    }
                }

                return std::make_tuple (next_state, error);
            }